

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O2

void __thiscall
directed_flag_complex_computer::compute_filtration_t::operator()
          (compute_filtration_t *this,vertex_index_t *first_vertex,int size)

{
  pointer phVar1;
  int iVar2;
  value_t *pvVar3;
  iterator iVar4;
  value_t *pvVar5;
  _func_int **pp_Var6;
  runtime_error *this_00;
  filtered_directed_graph_t *pfVar7;
  short sVar8;
  unsigned_short dim;
  ulong uVar9;
  filtration_algorithm_t *pfVar10;
  ulong uVar11;
  directed_flag_complex_cell_t cell;
  string local_a0;
  string err;
  directed_flag_complex_boundary_cell_t bdry;
  directed_flag_complex_cell_t local_48;
  ulong local_38;
  
  this->current_index = this->current_index + 1;
  cell._vptr_directed_flag_complex_cell_t = (_func_int **)&PTR_vertex_0015d298;
  dim = (unsigned_short)(size - 2U);
  if (size - 2U != (uint)cell_hasher_t::dimension) {
    cell_hasher_t::dimension = dim;
  }
  if (this->filtration_algorithm != (filtration_algorithm_t *)0x0) {
    cell.vertices = first_vertex;
    iVar2 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
    if ((char)iVar2 == '\0') {
      pfVar7 = this->graph;
      pfVar10 = this->filtration_algorithm;
      pp_Var6 = pfVar10->_vptr_filtration_algorithm_t;
      pvVar3 = (value_t *)0x0;
    }
    else {
      pvVar3 = this->boundary_filtration;
      if (pvVar3 == (value_t *)0x0) {
        uVar9 = 0xffffffffffffffff;
        if (-1 < size) {
          uVar9 = (ulong)(uint)size << 2;
        }
        pvVar3 = (value_t *)operator_new__(uVar9);
        this->boundary_filtration = pvVar3;
      }
      uVar11 = 0;
      uVar9 = 0;
      if (0 < size) {
        uVar9 = (ulong)(uint)size;
      }
      for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        bdry.super_directed_flag_complex_cell_t.vertices = cell.vertices;
        bdry.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t =
             (_func_int **)&PTR_vertex_0015d2b0;
        phVar1 = (this->cell_hash->
                 super__Vector_base<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bdry.i = uVar11;
        if ((this->cell_hash->
            super__Vector_base<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
            )._M_impl.super__Vector_impl_data._M_finish == phVar1) {
          pvVar5 = (this->current_filtration->super__Vector_base<float,_std::allocator<float>_>).
                   _M_impl.super__Vector_impl_data._M_start + cell.vertices[uVar11 == 0];
        }
        else {
          sVar8 = (short)((ulong)cell.vertices[uVar11 == 0] % this->nb_threads);
          iVar4 = std::
                  _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)(phVar1 + sVar8),&bdry.super_directed_flag_complex_cell_t);
          if (iVar4.
              super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__cxx11::string::string
                      ((string *)&err,"Could not find boundary ",(allocator *)&local_a0);
            local_48.vertices = cell.vertices;
            local_48._vptr_directed_flag_complex_cell_t = (_func_int **)&PTR_vertex_0015d2b0;
            local_38 = uVar11;
            directed_flag_complex_cell_t::to_string_abi_cxx11_(&local_a0,&local_48,dim);
            std::__cxx11::string::append((string *)&err);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::append((char *)&err);
            directed_flag_complex_cell_t::to_string_abi_cxx11_(&local_a0,&cell,(short)size - 1);
            std::__cxx11::string::append((string *)&err);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::append((char *)&err);
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,(string *)&err);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pvVar3 = this->boundary_filtration;
          pvVar5 = (this->current_filtration->super__Vector_base<float,_std::allocator<float>_>).
                   _M_impl.super__Vector_impl_data._M_start +
                   *(long *)((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
                                   ._M_cur + 0x18) + this->cell_hash_offsets[sVar8];
        }
        pvVar3[uVar11] = *pvVar5;
      }
      pfVar7 = this->graph;
      pfVar10 = this->filtration_algorithm;
      pp_Var6 = pfVar10->_vptr_filtration_algorithm_t;
    }
    (*pp_Var6[2])(pfVar10,(ulong)(size - 1U & 0xffff),&cell,pfVar7,pvVar3);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&this->next_filtration,(float *)&err);
  }
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size) {
		// The index starts at -1, so the first cell gets index 0
		current_index++;
		directed_flag_complex_cell_t cell(first_vertex);
		if (cell_hasher_t::dimension != size - 2) cell_hasher_t::set_current_cell_dimension(size - 2);

		if (filtration_algorithm == nullptr) return;

		if (filtration_algorithm->needs_face_filtration()) {
			if (boundary_filtration == nullptr) boundary_filtration = new value_t[size];

			for (int i = 0; i < size; i++) {
				auto bdry = cell.boundary(i);

				if (!cell_hash.size()) {
					// In the case where no cell hash is given, we are looking
					// at edges
					assert(size == 2);
					boundary_filtration[i] = current_filtration[bdry.vertex(0)];
				} else {
					// The threads are split by the first vertex
					const short thread_index = bdry.vertex(0) % nb_threads;
					auto pair = cell_hash[thread_index].find(bdry);

					if (pair == cell_hash[thread_index].end()) {
						std::string err = "Could not find boundary ";
						err += cell.boundary(i).to_string(size - 2);
						err += " of ";
						err += cell.to_string(size - 1);
						err += ".\n";
						throw std::runtime_error(err);
					}
					boundary_filtration[i] = current_filtration[pair->second + cell_hash_offsets[thread_index]];
				}
			}

			next_filtration.push_back(
			    filtration_algorithm->compute_filtration(size - 1, cell, graph, boundary_filtration));
		} else {
			next_filtration.push_back(filtration_algorithm->compute_filtration(size - 1, cell, graph, nullptr));
		}
	}